

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_Resize(ARKodeMem ark_mem,N_Vector y0,sunrealtype hscale,sunrealtype t0,
                  ARKVecResizeFn resize,void *resize_data)

{
  int iVar1;
  SUNNonlinearSolver NLS;
  long liw_diff;
  char *msgfmt;
  long lrw_diff;
  sunindextype liw1;
  sunindextype lrw1;
  ARKodeMRIStepMem step_mem;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_Resize",&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  liw1 = 0;
  lrw1 = 0;
  if (y0->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    N_VSpace(y0,&lrw1,&liw1);
  }
  lrw_diff = lrw1 - ark_mem->lrw1;
  liw_diff = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;
  if (step_mem->Fse != (N_Vector *)0x0) {
    iVar1 = arkResizeVecArray(resize,resize_data,step_mem->nstages_allocated,y0,&step_mem->Fse,
                              lrw_diff,&ark_mem->lrw,liw_diff,&ark_mem->liw);
    if (iVar1 == 0) {
      msgfmt = "Unable to resize vector";
      iVar1 = 0x1a3;
      goto LAB_00150756;
    }
    if (step_mem->unify_Fs != 0) {
      step_mem->Fsi = step_mem->Fse;
    }
  }
  if (((step_mem->Fsi == (N_Vector *)0x0) || (step_mem->unify_Fs != 0)) ||
     (iVar1 = arkResizeVecArray(resize,resize_data,step_mem->nstages_allocated,y0,&step_mem->Fsi,
                                lrw_diff,&ark_mem->lrw,liw_diff,&ark_mem->liw), iVar1 != 0)) {
    if ((step_mem->sdata == (N_Vector)0x0) ||
       (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->sdata),
       iVar1 != 0)) {
      if ((step_mem->zpred == (N_Vector)0x0) ||
         (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->zpred),
         iVar1 != 0)) {
        if ((step_mem->zcor == (N_Vector)0x0) ||
           (iVar1 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,&step_mem->zcor),
           iVar1 != 0)) {
          if ((step_mem->NLS != (SUNNonlinearSolver)0x0) && (step_mem->ownNLS != 0)) {
            iVar1 = SUNNonlinSolFree();
            if (iVar1 != 0) {
              return iVar1;
            }
            step_mem->NLS = (SUNNonlinearSolver)0x0;
            step_mem->ownNLS = 0;
            NLS = SUNNonlinSol_Newton(y0,ark_mem->sunctx);
            if (NLS == (SUNNonlinearSolver)0x0) {
              msgfmt = "Error creating default Newton solver";
              iVar1 = 0x1e5;
              goto LAB_00150756;
            }
            iVar1 = ARKodeSetNonlinearSolver(ark_mem,NLS);
            if (iVar1 != 0) {
              msgfmt = "Error attaching default Newton solver";
              iVar1 = 0x1ee;
              goto LAB_00150756;
            }
            step_mem->ownNLS = 1;
          }
          iVar1 = mriStepInnerStepper_Resize
                            (step_mem->stepper,resize,resize_data,lrw_diff,liw_diff,y0);
          if (iVar1 == 0) {
            if (step_mem->NLS == (SUNNonlinearSolver)0x0) {
              return 0;
            }
            step_mem->nsetups = 0;
            return 0;
          }
          msgfmt = "Unable to resize vector";
          iVar1 = 0x1fa;
        }
        else {
          msgfmt = "Unable to resize vector";
          iVar1 = 0x1d1;
        }
      }
      else {
        msgfmt = "Unable to resize vector";
        iVar1 = 0x1c7;
      }
    }
    else {
      msgfmt = "Unable to resize vector";
      iVar1 = 0x1bd;
    }
  }
  else {
    msgfmt = "Unable to resize vector";
    iVar1 = 0x1b1;
  }
LAB_00150756:
  arkProcessError(ark_mem,-0x14,iVar1,"mriStep_Resize",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                  ,msgfmt);
  return -0x14;
}

Assistant:

int mriStep_Resize(ARKodeMem ark_mem, N_Vector y0,
                   SUNDIALS_MAYBE_UNUSED sunrealtype hscale,
                   SUNDIALS_MAYBE_UNUSED sunrealtype t0, ARKVecResizeFn resize,
                   void* resize_data)
{
  ARKodeMRIStepMem step_mem;
  SUNNonlinearSolver NLS;
  sunindextype lrw1, liw1, lrw_diff, liw_diff;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Determine change in vector sizes */
  lrw1 = liw1 = 0;
  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  lrw_diff      = lrw1 - ark_mem->lrw1;
  liw_diff      = liw1 - ark_mem->liw1;
  ark_mem->lrw1 = lrw1;
  ark_mem->liw1 = liw1;

  /* Resize Fse */
  if (step_mem->Fse)
  {
    if (!arkResizeVecArray(resize, resize_data, step_mem->nstages_allocated, y0,
                           &(step_mem->Fse), lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
    if (step_mem->unify_Fs) { step_mem->Fsi = step_mem->Fse; }
  }

  /* Resize Fsi */
  if (step_mem->Fsi && !step_mem->unify_Fs)
  {
    if (!arkResizeVecArray(resize, resize_data, step_mem->nstages_allocated, y0,
                           &(step_mem->Fsi), lrw_diff, &(ark_mem->lrw),
                           liw_diff, &(ark_mem->liw)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  /* Resize the nonlinear solver interface vectors (if applicable) */
  if (step_mem->sdata != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->sdata))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }
  if (step_mem->zpred != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->zpred))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }
  if (step_mem->zcor != NULL)
  {
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                      &step_mem->zcor))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Unable to resize vector");
      return (ARK_MEM_FAIL);
    }
  }

  /* If a NLS object was previously used, destroy and recreate default Newton
     NLS object (can be replaced by user-defined object if desired) */
  if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
  {
    /* destroy existing NLS object */
    retval = SUNNonlinSolFree(step_mem->NLS);
    if (retval != ARK_SUCCESS) { return (retval); }
    step_mem->NLS    = NULL;
    step_mem->ownNLS = SUNFALSE;

    /* create new Newton NLS object */
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error creating default Newton solver");
      return (ARK_MEM_FAIL);
    }

    /* attach new Newton NLS object */
    retval = ARKodeSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error attaching default Newton solver");
      return (ARK_MEM_FAIL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Resize the inner stepper vectors */
  retval = mriStepInnerStepper_Resize(step_mem->stepper, resize, resize_data,
                                      lrw_diff, liw_diff, y0);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    "Unable to resize vector");
    return (ARK_MEM_FAIL);
  }

  /* reset nonlinear solver counters */
  if (step_mem->NLS != NULL) { step_mem->nsetups = 0; }

  return (ARK_SUCCESS);
}